

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

void __thiscall Centaurus::NFA<wchar_t>::NFA(NFA<wchar_t> *this,Stream *stream)

{
  CharClass<wchar_t> local_48;
  Stream *local_18;
  Stream *stream_local;
  NFA<wchar_t> *this_local;
  
  local_18 = stream;
  stream_local = (Stream *)this;
  NFABase<Centaurus::NFABaseState<wchar_t,_int>_>::NFABase
            (&this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>);
  (this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>)._vptr_NFABase =
       (_func_int **)&PTR__NFA_003134e0;
  std::
  vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
  ::emplace_back<>(&(this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states);
  CharClass<wchar_t>::CharClass(&local_48);
  add_state(this,&local_48);
  CharClass<wchar_t>::~CharClass(&local_48);
  parse(this,local_18);
  return;
}

Assistant:

NFA(Stream& stream)
    {
        m_states.emplace_back();
        add_state(CharClass<TCHAR>());
        
        parse(stream);
    }